

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::COMBICState::COMBICState
          (COMBICState *this,KUINT8 Index,KUINT32 TimeSinceCreation,EntityType *MunitionSource,
          KUINT32 NumberOfSources,KUINT16 GeometryIndex,KUINT32 SourceType,KFLOAT32 BarrageRate,
          KFLOAT32 BarrageDuration,KFLOAT32 BarrageCrosswindLength,KFLOAT32 BarrageDownwindLength,
          EulerAngles *DetonationVelocity)

{
  KFLOAT32 BarrageDownwindLength_local;
  KFLOAT32 BarrageCrosswindLength_local;
  KFLOAT32 BarrageDuration_local;
  KFLOAT32 BarrageRate_local;
  KUINT16 GeometryIndex_local;
  KUINT32 NumberOfSources_local;
  EntityType *MunitionSource_local;
  KUINT32 TimeSinceCreation_local;
  KUINT8 Index_local;
  COMBICState *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__COMBICState_0033f860;
  this->m_ui32TSC = TimeSinceCreation;
  EntityType::EntityType(&this->m_MunSrc,MunitionSource);
  this->m_ui32NumSrcs = NumberOfSources;
  this->m_ui16GeometryIndex = GeometryIndex;
  this->m_ui16Padding = 0;
  this->m_ui32SrcType = SourceType;
  this->m_f32BarrageRate = BarrageRate;
  this->m_f32BarrageDuration = BarrageDuration;
  this->m_f32BarrageCrosswindLength = BarrageCrosswindLength;
  this->m_f32BarrageDownwindLength = BarrageDownwindLength;
  EulerAngles::EulerAngles(&this->m_DetVel,DetonationVelocity);
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x100;
  (this->super_EnvironmentRecord).m_ui16Length = 0x200;
  return;
}

Assistant:

COMBICState::COMBICState( KUINT8 Index, KUINT32 TimeSinceCreation, const EntityType & MunitionSource,
                          KUINT32 NumberOfSources, KUINT16 GeometryIndex, KUINT32 SourceType,
                          KFLOAT32 BarrageRate, KFLOAT32 BarrageDuration, KFLOAT32 BarrageCrosswindLength,
                          KFLOAT32 BarrageDownwindLength, const EulerAngles & DetonationVelocity ) :
    m_ui32TSC( TimeSinceCreation ),
    m_MunSrc( MunitionSource ),
    m_ui32NumSrcs( NumberOfSources ),
    m_ui16GeometryIndex( GeometryIndex ),
    m_ui16Padding( 0 ),
    m_ui32SrcType( SourceType ),
    m_f32BarrageRate( BarrageRate ),
    m_f32BarrageDuration( BarrageDuration ),
    m_f32BarrageCrosswindLength( BarrageCrosswindLength ),
    m_f32BarrageDownwindLength( BarrageDownwindLength ),
    m_DetVel( DetonationVelocity ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = COMBICStateType;
    m_ui16Length = COMBIC_STATE_SIZE * 8;
}